

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

int start_cgreen_messaging(int tag)

{
  int iVar1;
  __pid_t _Var2;
  CgreenMessageQueue *pCVar3;
  int in_EDI;
  int atexit_result;
  int pipe_result;
  int pipes [2];
  CgreenMessageQueue *tmp;
  int *in_stack_ffffffffffffffd8;
  int local_18;
  int local_14;
  int local_4;
  
  if ((queue_count == 0) && (iVar1 = atexit(clean_up_messaging), iVar1 != 0)) {
    fprintf(_stderr,"could not register clean up code\n");
    local_4 = -1;
  }
  else {
    queue_count = queue_count + 1;
    pCVar3 = (CgreenMessageQueue *)realloc(queues,(long)queue_count << 4);
    if (pCVar3 == (CgreenMessageQueue *)0x0) {
      atexit(clean_up_messaging);
      local_4 = -1;
    }
    else {
      queues = pCVar3;
      iVar1 = cgreen_pipe_open(in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        queues[queue_count + -1].readpipe = local_18;
        queues[queue_count + -1].writepipe = local_14;
        _Var2 = getpid();
        queues[queue_count + -1].owner = _Var2;
        queues[queue_count + -1].tag = in_EDI;
        local_4 = queue_count + -1;
      }
      else {
        fprintf(_stderr,"could not create pipes\n");
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int start_cgreen_messaging(int tag) {
    CgreenMessageQueue *tmp;
    int pipes[2];
    int pipe_result;

    if (queue_count == 0) {
        int atexit_result = atexit(&clean_up_messaging);

        if (atexit_result != 0) {
            fprintf(stderr, "could not register clean up code\n");
            return -1;
        }
    }

    tmp = (CgreenMessageQueue *) realloc(queues, sizeof(CgreenMessageQueue) * ++queue_count);
    if (tmp == NULL) {
        /* ignoring return value here, as the world is ending anyways */
        (void)atexit(&clean_up_messaging);
        return -1;
    }
    queues = tmp;

    pipe_result = cgreen_pipe_open(pipes);
    if (pipe_result != 0) {
        fprintf(stderr, "could not create pipes\n");
        return -1;
    }

    queues[queue_count - 1].readpipe = pipes[0];
    queues[queue_count - 1].writepipe = pipes[1];
    queues[queue_count - 1].owner = getpid();
    queues[queue_count - 1].tag = tag;
    return queue_count - 1;
}